

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# n_pca.cpp
# Opt level: O2

int __thiscall n_pca::NPca::detector(NPca *this,Mat *image)

{
  int iVar1;
  Mat aMStack_78 [96];
  
  if ((*(int *)(image + 0xc) != this->n_config_->image_width_) ||
     (*(int *)(image + 8) != this->n_config_->image_height_)) {
    n_resize(this,image);
  }
  cv::Mat::reshape((int)aMStack_78,(int)image);
  cv::Mat::operator=(image,aMStack_78);
  cv::Mat::~Mat(aMStack_78);
  iVar1 = detector(this,*(u_char **)(image + 0x10));
  return iVar1;
}

Assistant:

int NPca::detector(Mat image)
{
    if (image.cols != n_config_->image_width_ || image.rows != n_config_->image_height_)
    {
        n_resize(image);
    }

    image = image.reshape(0,1);
    
    return detector(image.data);
}